

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  StringPtr *pSVar1;
  char *pcVar2;
  size_t sVar3;
  WirePointer *pWVar4;
  CapTableBuilder *pCVar5;
  Reader value;
  Fault local_80;
  DynamicEnum local_78;
  SegmentBuilder *local_68;
  CapTableBuilder *pCStack_60;
  WirePointer *local_58;
  size_t local_50;
  bool local_48;
  
  local_78.schema = input.schema.super_Schema.raw;
  local_78.value = input.value;
  DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&local_68,&local_78);
  pWVar4 = local_58;
  if ((char)local_68 == '\x01') {
    pCVar5 = (CapTableBuilder *)((ulong)local_58 & 0xffff);
    pCStack_60 = (CapTableBuilder *)(this->valueToName).size_;
    local_68 = (SegmentBuilder *)CONCAT44(local_68._4_4_,(uint)(ushort)local_58);
    local_58 = (WirePointer *)0x20202b;
    local_50 = 4;
    local_48 = pCVar5 < pCStack_60;
    if (pCStack_60 <= pCVar5) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x56b,FAILED,"e.getIndex() < valueToName.size()","_kjCondition,",
                 (DebugComparison<unsigned_int,_unsigned_long> *)&local_68);
      kj::_::Debug::Fault::fatal(&local_80);
    }
    pSVar1 = (this->valueToName).ptr;
    pcVar2 = pSVar1[(ulong)pWVar4 & 0xffff].content.ptr;
    sVar3 = pSVar1[(ulong)pWVar4 & 0xffff].content.size_;
    *(undefined2 *)output._builder.data = 3;
    local_68 = output._builder.segment;
    pCStack_60 = output._builder.capTable;
    local_58 = output._builder.pointers;
    value.super_StringPtr.content.size_ = sVar3;
    value.super_StringPtr.content.ptr = pcVar2;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_68,value);
  }
  else {
    *(undefined2 *)output._builder.data = 2;
    *(double *)((long)output._builder.data + 8) = (double)local_78.value;
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_SOME(e, input.getEnumerant()) {
      KJ_ASSERT(e.getIndex() < valueToName.size());
      output.setString(valueToName[e.getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }